

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::Player(Player *this)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  PhaseObserver *this_01;
  GameStatisticsObserver *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e0;
  undefined1 local_4d0 [8];
  vector<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_> buildingUnitTiles;
  vector<GameTokens,_std::allocator<GameTokens>_> gameTokens;
  vector<Cards,_std::allocator<Cards>_> cards;
  BoardFigures boardFigure;
  MonsterCards monsterCard;
  Dice dice;
  allocator local_1c0;
  allocator local_1bf;
  allocator local_1be;
  allocator local_1bd;
  allocator local_1bc;
  allocator local_1bb;
  allocator local_1ba;
  allocator local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  Player *local_10;
  Player *this_local;
  
  local_10 = this;
  Subject::Subject(&this->super_Subject);
  (this->super_Subject)._vptr_Subject = (_func_int **)&PTR_attach_0014c930;
  std::__cxx11::string::string((string *)&this->playerName);
  MonsterCards::MonsterCards(&this->monsterCard);
  BoardFigures::BoardFigures(&this->boardFigure);
  std::vector<Cards,_std::allocator<Cards>_>::vector(&this->cards);
  std::vector<GameTokens,_std::allocator<GameTokens>_>::vector(&this->gameTokens);
  std::vector<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>::vector
            (&this->buildingUnitTiles);
  dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  local_1b8 = &local_1b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"Manhattan",&local_1b9);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"Manhattan Lower 2-4",&local_1ba);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"Manhattan Midtown 2-4",&local_1bb);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"Manhattan Upper 2-4",&local_1bc);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"Manhattan Lower 5-6",&local_1bd);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"Manhattan Midtown 5-6",&local_1be);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Manhattan Upper 5-6",&local_1bf);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"Bronx",&local_1c0);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b0,"Queens",
             (allocator *)((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"Staten Island",
             (allocator *)((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 6)
            );
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,"Brooklyn",
             (allocator *)((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 5)
            );
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,"None",
             (allocator *)((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 4)
            );
  dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  local_30 = &local_1b0;
  local_28 = 0xc;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 2);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->zoneNames,__l,this_00);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 2));
  local_5e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    local_5e0 = local_5e0 + -1;
    std::__cxx11::string::~string((string *)local_5e0);
  } while (local_5e0 != &local_1b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&dice.diceMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::~allocator((allocator<char> *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bf);
  std::allocator<char>::~allocator((allocator<char> *)&local_1be);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bd);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bc);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bb);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ba);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  this->victoryPoints = 0;
  this->lifePoints = 10;
  this->energyCubes = 0;
  Dice::Dice((Dice *)&monsterCard.assigned);
  MonsterCards::MonsterCards((MonsterCards *)&boardFigure.super_MonsterCards.assigned);
  BoardFigures::BoardFigures
            ((BoardFigures *)
             &cards.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Cards,_std::allocator<Cards>_>::vector
            ((vector<Cards,_std::allocator<Cards>_> *)
             &gameTokens.super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<GameTokens,_std::allocator<GameTokens>_>::vector
            ((vector<GameTokens,_std::allocator<GameTokens>_> *)
             &buildingUnitTiles.
              super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>::vector
            ((vector<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_> *)local_4d0);
  this_01 = (PhaseObserver *)operator_new(0x10);
  PhaseObserver::PhaseObserver(this_01,&this->super_Subject);
  (**(this->super_Subject)._vptr_Subject)(this,this_01);
  this_02 = (GameStatisticsObserver *)operator_new(8);
  (this_02->super_Observer)._vptr_Observer = (_func_int **)0x0;
  GameStatisticsObserver::GameStatisticsObserver(this_02);
  (**(this->super_Subject)._vptr_Subject)(this,this_02);
  std::vector<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>::~vector
            ((vector<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_> *)local_4d0);
  std::vector<GameTokens,_std::allocator<GameTokens>_>::~vector
            ((vector<GameTokens,_std::allocator<GameTokens>_> *)
             &buildingUnitTiles.
              super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Cards,_std::allocator<Cards>_>::~vector
            ((vector<Cards,_std::allocator<Cards>_> *)
             &gameTokens.super__Vector_base<GameTokens,_std::allocator<GameTokens>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  BoardFigures::~BoardFigures
            ((BoardFigures *)
             &cards.super__Vector_base<Cards,_std::allocator<Cards>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  MonsterCards::~MonsterCards((MonsterCards *)&boardFigure.super_MonsterCards.assigned);
  Dice::~Dice((Dice *)&monsterCard.assigned);
  return;
}

Assistant:

Player::Player() {
    victoryPoints = 0;
    lifePoints= 10;
    energyCubes = 0;

    Dice dice; // Player dice obj
    MonsterCards monsterCard; // Player monster card
    BoardFigures boardFigure; // Player board fig
    vector <Cards> cards; //List of all deck cards assigned to player (purchased)
    vector <GameTokens> gameTokens; // List of all game tokens assigned to player
    vector <BuildingUnitTiles> buildingUnitTiles; // List of all building tiles assigned to player

    attach(new PhaseObserver(this));
    attach(new GameStatisticsObserver());
}